

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line.hpp
# Opt level: O1

tuple<pstore::maybe<pstore::command_line::option_*,_void>,_bool> * __thiscall
pstore::command_line::details::process_single_dash<std::ostream>
          (tuple<pstore::maybe<pstore::command_line::option_*,_void>,_bool> *__return_storage_ptr__,
          details *this,string *arg_name,string *program_name,
          basic_ostream<char,_std::char_traits<char>_> *errs)

{
  tuple<pstore::maybe<pstore::command_line::option_*,_void>,_bool> *ptVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  option **ppoVar6;
  type *ptVar7;
  byte bVar8;
  char name [2];
  maybe<pstore::command_line::option_*,_void> handler;
  char local_ba [2];
  maybe<pstore::command_line::option_*,_void> local_b8;
  maybe<pstore::command_line::option_*,_void> local_a8;
  uchar *local_98;
  type tStack_90;
  string local_68;
  tuple<pstore::maybe<pstore::command_line::option_*,_void>,_bool> *local_48;
  string *local_40;
  string *local_38;
  
  local_48 = __return_storage_ptr__;
  local_40 = arg_name;
  local_38 = program_name;
  bVar2 = starts_with((string *)this,"-");
  if (!bVar2) {
    assert_failed("starts_with (arg_name, \"-\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/command_line/command_line.hpp"
                  ,0xc5);
  }
  std::__cxx11::string::erase((ulong)this,0);
  local_b8._0_8_ = 0;
  local_b8.storage_ = (type)0x0;
  uVar4 = 1;
  do {
    bVar8 = (byte)uVar4;
    if (((uVar4 & 1) == 0) || (*(long *)(this + 8) == 0)) break;
    local_ba[0] = **(char **)this;
    local_ba[1] = 0;
    local_98 = tStack_90.__data + 8;
    sVar5 = strlen(local_ba);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,local_ba,local_ba + sVar5);
    find_handler((maybe<pstore::command_line::option_*,_void> *)&local_68,(string *)&local_98);
    maybe<pstore::command_line::option_*,_void>::operator=
              (&local_b8,(maybe<pstore::command_line::option_*,_void> *)&local_68);
    if ((char)local_68._M_dataplus._M_p == '\x01') {
      local_68._M_dataplus._M_p = local_68._M_dataplus._M_p & 0xffffffffffffff00;
    }
    if (local_98 != tStack_90.__data + 8) {
      operator_delete(local_98,tStack_90._8_8_ + 1);
    }
    if (local_b8.valid_ == true) {
      ppoVar6 = maybe<pstore::command_line::option_*,_void>::operator->(&local_b8);
      iVar3 = (*(*ppoVar6)->_vptr_option[9])();
      if ((char)iVar3 != '\0') goto LAB_0010b834;
      ppoVar6 = maybe<pstore::command_line::option_*,_void>::operator->(&local_b8);
      iVar3 = (*(*ppoVar6)->_vptr_option[0xe])();
      if ((char)iVar3 != '\0') {
        std::__cxx11::string::erase((ulong)this,0);
        if (*(long *)(this + 8) != 0) {
          local_a8.valid_ = false;
          bVar2 = local_b8.valid_ == true;
          if (bVar2) {
            ptVar7 = (type *)maybe<pstore::command_line::option_*,_void>::operator->(&local_b8);
            local_a8.storage_ = *ptVar7;
          }
          local_a8.valid_ = bVar2;
          bVar2 = handler_set_value(&local_a8,(string *)this);
          uVar4 = (uint)bVar2;
          if (local_a8.valid_ == true) {
            local_a8.valid_ = false;
          }
          *(undefined8 *)(this + 8) = 0;
          **(undefined1 **)this = 0;
          goto LAB_0010b981;
        }
        goto LAB_0010b8d1;
      }
      std::__cxx11::string::erase((ulong)this,0);
      ppoVar6 = maybe<pstore::command_line::option_*,_void>::operator->(&local_b8);
      uVar4 = (*(*ppoVar6)->_vptr_option[0x10])();
LAB_0010b981:
      bVar2 = true;
      if (local_b8.valid_ == true) {
        local_b8._0_8_ = local_b8._0_8_ & 0xffffffffffffff00;
      }
    }
    else {
LAB_0010b834:
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      sVar5 = strlen(local_ba);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,local_ba,local_ba + sVar5)
      ;
      tStack_90._8_8_ = 0;
      tStack_90._16_8_ = 0;
      local_98 = (uchar *)0x0;
      tStack_90.__align = (anon_struct_8_0_00000001_for___align)0x0;
      tStack_90._24_8_ = 0;
      report_unknown_option<std::ostream>
                (local_40,&local_68,
                 (maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                  *)&local_98,(basic_ostream<char,_std::char_traits<char>_> *)local_38);
      if ((local_98._0_1_ == true) &&
         (local_98 = (uchar *)((ulong)local_98 & 0xffffffffffffff00),
         tStack_90.__align != (anon_struct_8_0_00000001_for___align)((long)tStack_90.__data + 0x10))
         ) {
        operator_delete((void *)tStack_90.__align,tStack_90._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      uVar4 = 0;
LAB_0010b8d1:
      bVar2 = false;
    }
    bVar8 = (byte)uVar4;
  } while (bVar2);
  ptVar1 = local_48;
  (local_48->super__Tuple_impl<0UL,_pstore::maybe<pstore::command_line::option_*,_void>,_bool>).
  super__Tuple_impl<1UL,_bool>.super__Head_base<1UL,_bool,_false>._M_head_impl = (bool)(bVar8 & 1);
  (local_48->super__Tuple_impl<0UL,_pstore::maybe<pstore::command_line::option_*,_void>,_bool>).
  super__Head_base<0UL,_pstore::maybe<pstore::command_line::option_*,_void>,_false>._M_head_impl.
  valid_ = false;
  if (local_b8.valid_ == true) {
    ptVar7 = (type *)maybe<pstore::command_line::option_*,_void>::operator->(&local_b8);
    (ptVar1->super__Tuple_impl<0UL,_pstore::maybe<pstore::command_line::option_*,_void>,_bool>).
    super__Head_base<0UL,_pstore::maybe<pstore::command_line::option_*,_void>,_false>._M_head_impl.
    storage_ = *ptVar7;
    (ptVar1->super__Tuple_impl<0UL,_pstore::maybe<pstore::command_line::option_*,_void>,_bool>).
    super__Head_base<0UL,_pstore::maybe<pstore::command_line::option_*,_void>,_false>._M_head_impl.
    valid_ = true;
  }
  return ptVar1;
}

Assistant:

std::tuple<maybe<option *>, bool> process_single_dash (std::string arg_name,
                                                                   std::string const & program_name,
                                                                   ErrorStream & errs) {
                PSTORE_ASSERT (starts_with (arg_name, "-"));
                arg_name.erase (0, 1U); // Remove the leading dash.

                auto handler = nothing<option *> ();
                sticky_bool<false> ok{true};
                while (ok && !arg_name.empty ()) {
                    char const name[2]{arg_name[0], '\0'};
                    handler = find_handler (name);
                    if (!handler || (*handler)->is_positional ()) {
                        report_unknown_option (program_name, name, nothing<std::string> (), errs);
                        ok = false;
                        break;
                    }

                    if ((*handler)->takes_argument ()) {
                        arg_name.erase (0, 1U);
                        if (arg_name.length () == 0U) {
                            // No value was supplied immediately after the argument name. It
                            // could be the next argument.
                            break;
                        }
                        ok = handler_set_value (handler, arg_name);
                        arg_name.clear ();
                    } else {
                        arg_name.erase (0, 1U);
                        ok = (*handler)->add_occurrence ();
                    }
                    handler.reset ();
                }
                return std::make_tuple (std::move (handler), ok.get ());
            }